

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,pareto_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  
  if ((longdouble)0 < x._0_10_) {
    in_RAX = (result_type_conflict3 *)powl();
  }
  return in_RAX;
}

Assistant:

result_type cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return 1 - math::pow(1 + x / P.theta(), -P.gamma());
    }